

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DifferentialTest.h
# Opt level: O0

void DiffTestRecurse<Blob<64>,unsigned_long>
               (pfHash hash,Blob<64> *k1,Blob<64> *k2,unsigned_long *h1,unsigned_long *h2,int start,
               int bitsleft,vector<Blob<64>,_std::allocator<Blob<64>_>_> *diffs)

{
  int iVar1;
  Blob<64> *in_RCX;
  Blob<64> *in_RDX;
  pfHash in_RSI;
  code *in_RDI;
  unsigned_long *in_R8;
  uint32_t in_R9D;
  int unaff_retaddr;
  int in_stack_00000008;
  undefined4 in_stack_0000000c;
  vector<Blob<64>,_std::allocator<Blob<64>_>_> *in_stack_00000010;
  int i;
  int bits;
  int in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  vector<Blob<64>,_std::allocator<Blob<64>_>_> *in_stack_ffffffffffffffb0;
  Blob<64> *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 uVar2;
  uint32_t uVar3;
  
  uVar2 = 0x40;
  uVar3 = in_R9D;
  for (; (int)in_R9D < 0x40; in_R9D = in_R9D + 1) {
    flipbit(in_RDX,8,in_R9D);
    iVar1 = in_stack_00000008 + -1;
    (*in_RDI)(in_RDX,8,0,in_R8);
    if (*(unsigned_long *)in_RCX->bytes == *in_R8) {
      Blob<64>::operator^((Blob<64> *)CONCAT44(in_R9D,in_stack_ffffffffffffffc8),
                          in_stack_ffffffffffffffc0);
      std::vector<Blob<64>,_std::allocator<Blob<64>_>_>::push_back
                (in_stack_ffffffffffffffb0,
                 (value_type *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    }
    if (iVar1 != 0) {
      in_stack_ffffffffffffffb0 = in_stack_00000010;
      DiffTestRecurse<Blob<64>,unsigned_long>
                (in_RSI,in_RDX,in_RCX,in_R8,(unsigned_long *)CONCAT44(uVar3,uVar2),in_R9D,
                 unaff_retaddr,
                 (vector<Blob<64>,_std::allocator<Blob<64>_>_> *)CONCAT44(in_stack_0000000c,iVar1));
      in_stack_ffffffffffffffa8 = iVar1;
    }
    flipbit(in_RDX,8,in_R9D);
  }
  return;
}

Assistant:

void DiffTestRecurse ( pfHash hash, keytype & k1, keytype & k2, hashtype & h1, hashtype & h2, int start, int bitsleft, std::vector<keytype> & diffs )
{
  const int bits = sizeof(keytype)*8;

  for(int i = start; i < bits; i++)
  {
    flipbit(&k2,sizeof(k2),i);
    bitsleft--;

    hash(&k2,sizeof(k2),0,&h2);

    if(h1 == h2)
    {
      diffs.push_back(k1 ^ k2);
    }

    if(bitsleft)
    {
      DiffTestRecurse(hash,k1,k2,h1,h2,i+1,bitsleft,diffs);
    }

    flipbit(&k2,sizeof(k2),i);
    bitsleft++;
  }
}